

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  LongSooRep *pLVar1;
  ulong uVar2;
  undefined8 *puVar3;
  int iVar4;
  bool bVar5;
  
  if (this->is_repeated == true) {
    if ((byte)(this->type - 0x13) < 0xee) {
      Clear((Extension *)&stack0xffffffffffffffd8);
LAB_002809b7:
      Clear((Extension *)&stack0xffffffffffffffd8);
    }
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4)) {
    case 1:
    case 8:
      pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
      uVar2 = pLVar1->elements_int;
      if ((uVar2 & 4) != 0) {
        LongSooRep::elements(pLVar1);
      }
      bVar5 = (uVar2 & 4) == 0;
      SooRep::size((SooRep *)pLVar1,bVar5);
      iVar4 = SooRep::size((SooRep *)pLVar1,bVar5);
      if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar1);
      }
      RepeatedField<int>::set_size((RepeatedField<int> *)pLVar1,(uVar2 & 4) == 0,0);
      return;
    case 2:
      pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
      uVar2 = pLVar1->elements_int;
      if ((uVar2 & 4) != 0) {
        LongSooRep::elements(pLVar1);
      }
      bVar5 = (uVar2 & 4) == 0;
      SooRep::size((SooRep *)pLVar1,bVar5);
      iVar4 = SooRep::size((SooRep *)pLVar1,bVar5);
      if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar1);
      }
      RepeatedField<long>::set_size((RepeatedField<long> *)pLVar1,(uVar2 & 4) == 0,0);
      return;
    case 3:
      pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
      uVar2 = pLVar1->elements_int;
      if ((uVar2 & 4) != 0) {
        LongSooRep::elements(pLVar1);
      }
      bVar5 = (uVar2 & 4) == 0;
      SooRep::size((SooRep *)pLVar1,bVar5);
      iVar4 = SooRep::size((SooRep *)pLVar1,bVar5);
      if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar1);
      }
      RepeatedField<unsigned_int>::set_size
                ((RepeatedField<unsigned_int> *)pLVar1,(uVar2 & 4) == 0,0);
      return;
    case 4:
      pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
      uVar2 = pLVar1->elements_int;
      if ((uVar2 & 4) != 0) {
        LongSooRep::elements(pLVar1);
      }
      bVar5 = (uVar2 & 4) == 0;
      SooRep::size((SooRep *)pLVar1,bVar5);
      iVar4 = SooRep::size((SooRep *)pLVar1,bVar5);
      if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar1);
      }
      RepeatedField<unsigned_long>::set_size
                ((RepeatedField<unsigned_long> *)pLVar1,(uVar2 & 4) == 0,0);
      return;
    case 5:
      pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
      uVar2 = pLVar1->elements_int;
      if ((uVar2 & 4) != 0) {
        LongSooRep::elements(pLVar1);
      }
      bVar5 = (uVar2 & 4) == 0;
      SooRep::size((SooRep *)pLVar1,bVar5);
      iVar4 = SooRep::size((SooRep *)pLVar1,bVar5);
      if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar1);
      }
      RepeatedField<double>::set_size((RepeatedField<double> *)pLVar1,(uVar2 & 4) == 0,0);
      return;
    case 6:
      pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
      uVar2 = pLVar1->elements_int;
      if ((uVar2 & 4) != 0) {
        LongSooRep::elements(pLVar1);
      }
      bVar5 = (uVar2 & 4) == 0;
      SooRep::size((SooRep *)pLVar1,bVar5);
      iVar4 = SooRep::size((SooRep *)pLVar1,bVar5);
      if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar1);
      }
      RepeatedField<float>::set_size((RepeatedField<float> *)pLVar1,(uVar2 & 4) == 0,0);
      return;
    case 7:
      pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
      uVar2 = pLVar1->elements_int;
      if ((uVar2 & 4) != 0) {
        LongSooRep::elements(pLVar1);
      }
      bVar5 = (uVar2 & 4) == 0;
      SooRep::size((SooRep *)pLVar1,bVar5);
      iVar4 = SooRep::size((SooRep *)pLVar1,bVar5);
      if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar1);
      }
      RepeatedField<bool>::set_size((RepeatedField<bool> *)pLVar1,(uVar2 & 4) == 0,0);
      return;
    case 9:
      RepeatedPtrFieldBase::
      Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                ((RepeatedPtrFieldBase *)this->field_0);
      return;
    case 10:
      RepeatedPtrFieldBase::
      Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                ((RepeatedPtrFieldBase *)this->field_0);
      return;
    }
  }
  else if ((this->field_0xa & 2) == 0) {
    if ((byte)(this->type - 0x13) < 0xee) goto LAB_002809b7;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4) == 10) {
      if ((this->field_0xa & 4) == 0) {
        (**(code **)(*(long *)this->field_0 + 0x10))();
      }
      else {
        (**(code **)(*(long *)this->field_0 + 0x90))();
      }
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4) == 9) {
      puVar3 = (undefined8 *)(this->field_0).int64_t_value;
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
    this->field_0xa = this->field_0xa | 2;
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)      \
  case WireFormatLite::CPPTYPE_##UPPERCASE:    \
    ptr.repeated_##LOWERCASE##_value->Clear(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          ptr.string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            ptr.lazymessage_value->Clear();
          } else {
            ptr.message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}